

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

void __thiscall nv::FloatImage::normalize(FloatImage *this,uint base_component)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (this->m_componentNum < base_component + 3) {
    iVar4 = nvAbort("base_component + 3 <= m_componentNum",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0xaa,"void nv::FloatImage::normalize(uint)");
    if (iVar4 == 1) {
      raise(5);
    }
  }
  uVar7 = (uint)this->m_height * (uint)this->m_width;
  if (uVar7 != 0) {
    pfVar1 = this->m_mem;
    uVar5 = (base_component + 1) * uVar7;
    uVar6 = (base_component + 2) * uVar7;
    uVar8 = 0;
    do {
      fVar9 = pfVar1[uVar7 * base_component + uVar8];
      fVar10 = pfVar1[uVar5 + uVar8];
      fVar11 = pfVar1[uVar6 + uVar8];
      fVar12 = SQRT(fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10);
      bVar2 = NAN(fVar12);
      bVar3 = fVar12 == 0.0;
      fVar12 = 1.0 / fVar12;
      fVar9 = fVar9 * fVar12;
      if ((bVar3) && (!bVar2)) {
        fVar9 = 0.0;
      }
      fVar10 = fVar10 * fVar12;
      if ((bVar3) && (!bVar2)) {
        fVar10 = 0.0;
      }
      fVar11 = fVar11 * fVar12;
      if ((bVar3) && (!bVar2)) {
        fVar11 = 0.0;
      }
      pfVar1[uVar7 * base_component + uVar8] = fVar9;
      pfVar1[uVar5 + uVar8] = fVar10;
      pfVar1[uVar6 + uVar8] = fVar11;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

void FloatImage::normalize(uint base_component)
{
	nvCheck(base_component + 3 <= m_componentNum);
	
	float * xChannel = this->channel(base_component + 0);
	float * yChannel = this->channel(base_component + 1);
	float * zChannel = this->channel(base_component + 2);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		Vector3 normal(xChannel[i], yChannel[i], zChannel[i]);
		normal = normalizeSafe(normal, Vector3(zero), 0.0f);
		
		xChannel[i] = normal.x();
		yChannel[i] = normal.y();
		zChannel[i] = normal.z();
	}
}